

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O1

void sha512_Transform(sha2_word64 *state_in,sha2_word64 *data,sha2_word64 *state_out)

{
  ulong uVar1;
  sha2_word64 sVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  sha2_word64 *psVar10;
  sha2_word64 *psVar11;
  long lVar12;
  sha2_word64 sVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  sha2_word64 sVar21;
  ulong uVar22;
  sha2_word64 sVar23;
  ulong uVar24;
  sha2_word64 local_b8 [17];
  
  uVar1 = *state_in;
  uVar8 = state_in[1];
  sVar13 = state_in[2];
  sVar23 = state_in[3];
  sVar21 = state_in[4];
  sVar2 = state_in[5];
  uVar3 = state_in[6];
  uVar14 = state_in[7];
  psVar10 = data;
  psVar11 = local_b8;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    *psVar11 = *psVar10;
    psVar10 = psVar10 + 1;
    psVar11 = psVar11 + 1;
  }
  lVar6 = 0;
  uVar7 = uVar1;
  do {
    uVar20 = sVar21;
    uVar24 = sVar13;
    uVar16 = sVar2;
    sVar13 = uVar8;
    uVar8 = uVar7;
    uVar15 = uVar3;
    lVar12 = ((uVar16 ^ uVar15) & uVar20 ^ uVar15) + uVar14 +
             ((uVar20 << 0x17 | uVar20 >> 0x29) ^
             (uVar20 << 0x2e | uVar20 >> 0x12) ^ (uVar20 << 0x32 | uVar20 >> 0xe)) +
             *(long *)((long)K512 + lVar6) + *(long *)((long)data + lVar6);
    sVar21 = sVar23 + lVar12;
    uVar7 = (uVar24 & sVar13 ^ (uVar24 ^ sVar13) & uVar8) +
            ((uVar8 << 0x19 | uVar8 >> 0x27) ^
            (uVar8 << 0x1e | uVar8 >> 0x22) ^ (uVar8 << 0x24 | uVar8 >> 0x1c)) + lVar12;
    lVar6 = lVar6 + 8;
    uVar3 = uVar16;
    uVar14 = uVar15;
    sVar2 = uVar20;
    sVar23 = uVar24;
  } while (lVar6 != 0x80);
  lVar6 = 0x1e;
  do {
    uVar22 = sVar21;
    uVar19 = uVar8;
    uVar18 = sVar13;
    uVar17 = uVar20;
    uVar8 = uVar7;
    uVar5 = uVar16;
    uVar4 = (uint)lVar6;
    uVar3 = local_b8[uVar4 - 0xd & 0xf];
    uVar14 = local_b8[uVar4 & 0xf];
    lVar12 = *(long *)(K256 + lVar6 * 2 + 0x24);
    uVar9 = uVar4 - 0xe & 0xf;
    sVar13 = (uVar3 >> 7 ^
             (uVar3 << 0x38 | uVar3 >> 8) ^ (uVar3 >> 1 | (ulong)((uVar3 & 1) != 0) << 0x3f)) +
             local_b8[uVar4 - 5 & 0xf] +
             (uVar14 >> 6 ^ (uVar14 << 3 | uVar14 >> 0x3d) ^ (uVar14 << 0x2d | uVar14 >> 0x13)) +
             local_b8[uVar9];
    local_b8[uVar9] = sVar13;
    lVar12 = sVar13 + ((uVar17 ^ uVar5) & uVar22 ^ uVar5) + uVar15 +
                      ((uVar22 << 0x17 | uVar22 >> 0x29) ^
                      (uVar22 << 0x2e | uVar22 >> 0x12) ^ (uVar22 << 0x32 | uVar22 >> 0xe)) + lVar12
    ;
    sVar21 = uVar24 + lVar12;
    uVar7 = (uVar18 & uVar19 ^ (uVar18 ^ uVar19) & uVar8) +
            ((uVar8 << 0x19 | uVar8 >> 0x27) ^
            (uVar8 << 0x1e | uVar8 >> 0x22) ^ (uVar8 << 0x24 | uVar8 >> 0x1c)) + lVar12;
    lVar6 = lVar6 + 1;
    uVar16 = uVar17;
    uVar15 = uVar5;
    uVar20 = uVar22;
    sVar13 = uVar19;
    uVar24 = uVar18;
  } while (lVar6 != 0x5e);
  *state_out = uVar7 + uVar1;
  state_out[1] = uVar8 + state_in[1];
  state_out[2] = uVar19 + state_in[2];
  state_out[3] = uVar18 + state_in[3];
  state_out[4] = sVar21 + state_in[4];
  state_out[5] = uVar22 + state_in[5];
  state_out[6] = uVar17 + state_in[6];
  state_out[7] = uVar5 + state_in[7];
  return;
}

Assistant:

void sha512_Transform(const sha2_word64* state_in, const sha2_word64* data, sha2_word64* state_out) {
	sha2_word64	a, b, c, d, e, f, g, h, s0, s1;
	sha2_word64	T1, T2, W512[16];
	int		j;

	/* Initialize registers with the prev. intermediate value */
	a = state_in[0];
	b = state_in[1];
	c = state_in[2];
	d = state_in[3];
	e = state_in[4];
	f = state_in[5];
	g = state_in[6];
	h = state_in[7];

	j = 0;
	do {
		/* Apply the SHA-512 compression function to update a..h with copy */
		T1 = h + Sigma1_512(e) + Ch(e, f, g) + K512[j] + (W512[j] = *data++);
		T2 = Sigma0_512(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 16);

	do {
		/* Part of the message block expansion: */
		s0 = W512[(j+1)&0x0f];
		s0 = sigma0_512(s0);
		s1 = W512[(j+14)&0x0f];
		s1 =  sigma1_512(s1);

		/* Apply the SHA-512 compression function to update a..h */
		T1 = h + Sigma1_512(e) + Ch(e, f, g) + K512[j] +
		     (W512[j&0x0f] += s1 + W512[(j+9)&0x0f] + s0);
		T2 = Sigma0_512(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 80);

	/* Compute the current intermediate hash value */
	state_out[0] = state_in[0] + a;
	state_out[1] = state_in[1] + b;
	state_out[2] = state_in[2] + c;
	state_out[3] = state_in[3] + d;
	state_out[4] = state_in[4] + e;
	state_out[5] = state_in[5] + f;
	state_out[6] = state_in[6] + g;
	state_out[7] = state_in[7] + h;
}